

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::js::(anonymous_namespace)::GetPrefix_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,GeneratorOptions *options,
          FileDescriptor *file_descriptor,Descriptor *containing_type)

{
  ulong uVar1;
  Descriptor *descriptor;
  string local_70;
  string local_50;
  undefined1 local_29;
  _anonymous_namespace_ *local_28;
  Descriptor *containing_type_local;
  FileDescriptor *file_descriptor_local;
  GeneratorOptions *options_local;
  string *prefix;
  
  local_29 = 0;
  local_28 = (_anonymous_namespace_ *)file_descriptor;
  containing_type_local = (Descriptor *)options;
  file_descriptor_local = (FileDescriptor *)this;
  options_local = (GeneratorOptions *)__return_storage_ptr__;
  GetNamespace_abi_cxx11_(&local_50,this,options,file_descriptor);
  GetNestedMessageName_abi_cxx11_(&local_70,local_28,descriptor);
  std::operator+(__return_storage_ptr__,&local_50,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,".");
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetPrefix(const GeneratorOptions& options,
                      const FileDescriptor* file_descriptor,
                      const Descriptor* containing_type) {
  std::string prefix = GetNamespace(options, file_descriptor) +
                       GetNestedMessageName(containing_type);
  if (!prefix.empty()) {
    prefix += ".";
  }
  return prefix;
}